

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool __thiscall BaseIndex::Rewind(BaseIndex *this,CBlockIndex *current_tip,CBlockIndex *new_tip)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  __pointer_type pCVar4;
  BaseIndex *pBVar5;
  BaseIndex *in_RDX;
  __pointer_type in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  __pointer_type pCVar6;
  CBlockIndex *this_00;
  bool local_51;
  undefined1 local_50 [32];
  int local_30;
  undefined1 local_2c [28];
  undefined4 in_stack_fffffffffffffff0;
  int iVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = in_RSI;
  this_00 = in_RDI;
  pCVar4 = std::atomic::operator_cast_to_CBlockIndex_
                     ((atomic<const_CBlockIndex_*> *)
                      CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (in_RSI != pCVar4) {
    __assert_fail("current_tip == m_best_block_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0xf9,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
  }
  pBVar5 = (BaseIndex *)CBlockIndex::GetAncestor(this_00,(int)((ulong)pCVar6 >> 0x20));
  if (pBVar5 == in_RDX) {
    CBlockIndex::GetBlockHash(in_RSI);
    iVar7 = pCVar6->nHeight;
    CBlockIndex::GetBlockHash(in_RSI);
    local_30 = (int)(in_RDX->m_thread_sync)._M_id._M_thread;
    bVar2 = (**(code **)(in_RDI->phashBlock[3].super_base_blob<256U>.m_data._M_elems + 0x10))
                      (in_RDI,local_2c,local_50);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      SetBestBlockIndex(in_RDX,in_RSI);
      bVar3 = Commit((BaseIndex *)CONCAT44(iVar7,in_stack_fffffffffffffff0));
      if (bVar3) {
        local_51 = true;
      }
      else {
        SetBestBlockIndex(in_RDX,in_RSI);
        local_51 = false;
      }
    }
    else {
      local_51 = false;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_51;
    }
    __stack_chk_fail();
  }
  __assert_fail("current_tip->GetAncestor(new_tip->nHeight) == new_tip",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                ,0xfa,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
}

Assistant:

bool BaseIndex::Rewind(const CBlockIndex* current_tip, const CBlockIndex* new_tip)
{
    assert(current_tip == m_best_block_index);
    assert(current_tip->GetAncestor(new_tip->nHeight) == new_tip);

    if (!CustomRewind({current_tip->GetBlockHash(), current_tip->nHeight}, {new_tip->GetBlockHash(), new_tip->nHeight})) {
        return false;
    }

    // In the case of a reorg, ensure persisted block locator is not stale.
    // Pruning has a minimum of 288 blocks-to-keep and getting the index
    // out of sync may be possible but a users fault.
    // In case we reorg beyond the pruned depth, ReadBlockFromDisk would
    // throw and lead to a graceful shutdown
    SetBestBlockIndex(new_tip);
    if (!Commit()) {
        // If commit fails, revert the best block index to avoid corruption.
        SetBestBlockIndex(current_tip);
        return false;
    }

    return true;
}